

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sysbvm_tuple_t sysbvm_filesystem_getWorkingDirectory(sysbvm_context_t *context)

{
  char *__buf;
  char *cstring;
  sysbvm_tuple_t sVar1;
  
  __buf = (char *)malloc(0x1000);
  cstring = getcwd(__buf,0x1000);
  if (cstring == (char *)0x0) {
    sVar1 = sysbvm_string_createEmptyWithSize(context,0);
  }
  else {
    sVar1 = sysbvm_string_createWithCString(context,cstring);
  }
  free(__buf);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_getWorkingDirectory(sysbvm_context_t *context)
{
#ifdef _WIN32
    DWORD requiredBufferSize = GetCurrentDirectoryW(0, NULL);
    wchar_t *buffer = (wchar_t *)malloc(requiredBufferSize*2);
    GetCurrentDirectoryW(requiredBufferSize, buffer);

    int resultStringBufferSize = WideCharToMultiByte(CP_UTF8, 0, buffer, -1, NULL, 0, NULL, NULL);
    SYSBVM_ASSERT(resultStringBufferSize > 0);
    int resultStringSize = resultStringBufferSize - 1;

    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultStringSize);
    WideCharToMultiByte(CP_UTF8, 0, buffer, -1, (LPSTR)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes, resultStringSize, NULL, NULL);
    free(buffer);

    return result;
#else
    char *buffer = malloc(PATH_MAX);
    char *result = getcwd(buffer, PATH_MAX);
    sysbvm_tuple_t resultTuple;
    if(result)
        resultTuple = sysbvm_string_createWithCString(context, result);
    else
        resultTuple = sysbvm_string_createEmptyWithSize(context, 0);
    free(buffer);
    return resultTuple;
#endif
}